

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

PortInfo kratos::InlineGeneratorVisitor::get_port_assignment(Port *port)

{
  PortDirection PVar1;
  long lVar2;
  _func_int **pp_Var3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  undefined4 extraout_var_01;
  long *plVar7;
  AssignStmt *pAVar8;
  PortInfo PVar9;
  
  PVar1 = port->direction_;
  iVar5 = (*(port->super_Var).super_IRNode._vptr_IRNode[0xd])();
  lVar2 = *(long *)(CONCAT44(extraout_var,iVar5) + 0x2d0);
  pp_Var3 = (port->super_Var).super_IRNode._vptr_IRNode;
  if (port->direction_ == In) {
    iVar5 = (*pp_Var3[0x10])(port);
    plVar7 = (long *)(CONCAT44(extraout_var_01,iVar5) + 0x10);
    pAVar8 = (AssignStmt *)0x0;
    do {
      plVar7 = (long *)*plVar7;
      if (plVar7 == (long *)0x0) break;
      bVar4 = true;
      if (((Port *)((long *)plVar7[1])[0x18] == port) &&
         (lVar6 = (**(code **)(*(long *)plVar7[1] + 0x20))(), lVar6 == lVar2)) {
        if (pAVar8 == (AssignStmt *)0x0) {
          pAVar8 = (AssignStmt *)plVar7[1];
        }
        else {
          bVar4 = false;
          pAVar8 = (AssignStmt *)0x0;
        }
      }
    } while (bVar4);
  }
  else {
    iVar5 = (*pp_Var3[0xe])();
    plVar7 = (long *)(CONCAT44(extraout_var_00,iVar5) + 0x10);
    pAVar8 = (AssignStmt *)0x0;
    do {
      plVar7 = (long *)*plVar7;
      if (plVar7 == (long *)0x0) break;
      bVar4 = true;
      if (((Port *)((long *)plVar7[1])[0x19] == port) &&
         (lVar6 = (**(code **)(*(long *)plVar7[1] + 0x20))(), lVar6 == lVar2)) {
        if (pAVar8 == (AssignStmt *)0x0) {
          pAVar8 = (AssignStmt *)plVar7[1];
        }
        else {
          bVar4 = false;
          pAVar8 = (AssignStmt *)0x0;
        }
      }
    } while (bVar4);
  }
  PVar9._4_4_ = 0;
  PVar9.direction = PVar1;
  PVar9.stmt = pAVar8;
  return PVar9;
}

Assistant:

static PortInfo get_port_assignment(Port* port) {
        PortInfo info{port->port_direction(), nullptr};
        auto* gen_parent = port->generator()->parent_generator();
        if (port->port_direction() == PortDirection::In) {
            // assume we have handled the port decouple
            auto const& sources = port->sources();
            for (auto const& stmt : sources) {
                if (stmt->left() == port && stmt->parent() == gen_parent) {
                    if (info.stmt) {
                        // illegal state, return nothing just to be safe
                        info.stmt = nullptr;
                        return info;
                    }
                    info.stmt = stmt.get();
                }
            }
        } else {
            auto const& sinks = port->sinks();
            for (auto const& stmt : sinks) {
                if (stmt->right() == port && stmt->parent() == gen_parent) {
                    if (info.stmt) {
                        // illegal state, return nothing just to be safe
                        info.stmt = nullptr;
                        return info;
                    }
                    info.stmt = stmt.get();
                }
            }
        }
        return info;
    }